

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O2

int __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
::
MapFind__Impl<mp::CustomFunctionalConstraint<std::array<int,2ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::PowId>>
          (FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
           *this,CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowId>
                 *con)

{
  int iVar1;
  const_iterator cVar2;
  key_type local_8;
  
  local_8._M_data = con;
  cVar2 = std::
          _Hashtable<std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowId>_>,_std::pair<const_std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowId>_>,_int>,_std::allocator<std::pair<const_std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowId>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowId>_>_>,_std::hash<std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowId>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowId>_>,_std::pair<const_std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowId>_>,_int>,_std::allocator<std::pair<const_std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowId>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowId>_>_>,_std::hash<std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowId>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)(this + 0x4720),&local_8);
  if (cVar2.
      super__Node_iterator_base<std::pair<const_std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowId>_>,_int>,_true>
      ._M_cur == (__node_type *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = *(int *)((long)cVar2.
                           super__Node_iterator_base<std::pair<const_std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowId>_>,_int>,_true>
                           ._M_cur + 0x10);
  }
  return iVar1;
}

Assistant:

int MapFind__Impl(const Constraint& con) {
    const auto& map = GET_CONST_CONSTRAINT_MAP(Constraint);
    auto it = map.find( con );
    return (map.end() != it) ? it->second : -1;
  }